

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

SVInt __thiscall slang::SVInt::sext(SVInt *this,bitwidth_t bits)

{
  uint64_t *output;
  uint32_t oldWords_00;
  uint32_t newWords_00;
  uint64_t *input;
  uint in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar1;
  undefined4 in_register_00000034;
  SVInt *this_00;
  SVInt SVar2;
  uint32_t newWords;
  uint32_t oldWords;
  uint64_t newVal;
  bitwidth_t bits_local;
  SVInt *this_local;
  SVInt *result;
  
  this_00 = (SVInt *)CONCAT44(in_register_00000034,bits);
  if ((this_00->super_SVIntStorage).bitWidth < in_EDX) {
    if ((in_EDX < 0x41) && (((this_00->super_SVIntStorage).unknownFlag & 1U) == 0)) {
      SVInt(this,in_EDX,
            (ulong)((long)((this_00->super_SVIntStorage).field_0.val <<
                          (0x40U - (char)(this_00->super_SVIntStorage).bitWidth & 0x3f)) >>
                   ((char)in_EDX - (char)(this_00->super_SVIntStorage).bitWidth & 0x3fU)) >>
            (0x40U - (char)in_EDX & 0x3f),(bool)((this_00->super_SVIntStorage).signFlag & 1));
      uVar1 = extraout_RDX;
    }
    else {
      allocUninitialized(this,in_EDX,(bool)((this_00->super_SVIntStorage).signFlag & 1),
                         (bool)((this_00->super_SVIntStorage).unknownFlag & 1));
      oldWords_00 = getNumWords((this_00->super_SVIntStorage).bitWidth,false);
      newWords_00 = getNumWords(in_EDX,false);
      output = (this->super_SVIntStorage).field_0.pVal;
      input = getRawData(this_00);
      signExtendCopy(output,input,(this_00->super_SVIntStorage).bitWidth,oldWords_00,newWords_00);
      if (((this_00->super_SVIntStorage).unknownFlag & 1U) != 0) {
        signExtendCopy((this->super_SVIntStorage).field_0.pVal + newWords_00,
                       (this_00->super_SVIntStorage).field_0.pVal + oldWords_00,
                       (this_00->super_SVIntStorage).bitWidth,oldWords_00,newWords_00);
      }
      clearUnusedBits(this);
      uVar1 = extraout_RDX_00;
    }
    SVar2.super_SVIntStorage.bitWidth = (int)uVar1;
    SVar2.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar1 >> 0x20);
    SVar2.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar1 >> 0x28);
    SVar2.super_SVIntStorage._14_2_ = (short)((ulong)uVar1 >> 0x30);
    SVar2.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
    return (SVInt)SVar2.super_SVIntStorage;
  }
  assert::assertFailed
            ("bits > bitWidth",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/numeric/SVInt.cpp"
             ,0x602,"SVInt slang::SVInt::sext(bitwidth_t) const");
}

Assistant:

SVInt SVInt::sext(bitwidth_t bits) const {
    ASSERT(bits > bitWidth);

    if (bits <= SVInt::BITS_PER_WORD && !unknownFlag) {
        uint64_t newVal = val << (SVInt::BITS_PER_WORD - bitWidth); // NOLINT
        newVal = uint64_t((int64_t)newVal >> (bits - bitWidth));
        return SVInt(bits, newVal >> (SVInt::BITS_PER_WORD - bits), signFlag);
    }

    // copy and sign extend; for unknown values, this copies the data words
    // but not the unknown-indicator words, which we do separately below
    SVInt result = SVInt::allocUninitialized(bits, signFlag, unknownFlag);
    uint32_t oldWords = SVInt::getNumWords(bitWidth, false);
    uint32_t newWords = SVInt::getNumWords(bits, false);
    signExtendCopy(result.pVal, getRawData(), bitWidth, oldWords, newWords);

    if (unknownFlag)
        signExtendCopy(result.pVal + newWords, pVal + oldWords, bitWidth, oldWords, newWords);

    result.clearUnusedBits();
    return result;
}